

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::DebugNodeInputTextState(ImGuiInputTextState *state)

{
  bool bVar1;
  uint *puVar2;
  uint *in_RDI;
  float fVar3;
  char buf [64];
  char undo_rec_type;
  StbUndoRecord *undo_rec;
  int n;
  StbUndoState *undo_state;
  STB_TexteditState *stb_state;
  ImGuiContext *g;
  undefined1 *in_stack_ffffffffffffff60;
  ImVec2 *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  char in_stack_ffffffffffffff76;
  char in_stack_ffffffffffffff77;
  char cVar4;
  undefined1 local_88 [4];
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  ImVec2 *in_stack_ffffffffffffff88;
  ImGuiStyleVar in_stack_ffffffffffffff94;
  ImGuiID in_stack_ffffffffffffffb4;
  uint local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  uint *local_20;
  uint *local_18;
  ImGuiContext *local_10;
  uint *local_8;
  
  local_10 = GImGui;
  local_18 = in_RDI + 0x13;
  local_20 = in_RDI + 0x1b;
  local_8 = in_RDI;
  Text("ID: 0x%08X, ActiveID: 0x%08X",(ulong)*in_RDI,(ulong)GImGui->ActiveId);
  DebugLocateItemOnHover(in_stack_ffffffffffffffb4);
  Text("CurLenW: %d, CurLenA: %d, Cursor: %d, Selection: %d..%d",(ulong)local_8[2],(ulong)local_8[1]
       ,(ulong)*local_18,(ulong)local_18[1],(ulong)local_18[2]);
  Text("undo_point: %d, redo_point: %d, undo_char_point: %d, redo_char_point: %d",
       (ulong)(uint)(int)*(short *)((long)local_20 + 0xdfe),(ulong)(uint)(int)(short)local_20[0x380]
       ,(ulong)local_20[0x381],(ulong)local_20[0x382]);
  fVar3 = GetTextLineHeight();
  ImVec2::ImVec2(&local_28,0.0,fVar3 * 15.0);
  bVar1 = BeginChild((char *)CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(in_stack_ffffffffffffff76,
                                               CONCAT15(in_stack_ffffffffffffff75,
                                                        CONCAT14(in_stack_ffffffffffffff74,
                                                                 in_stack_ffffffffffffff70)))),
                     in_stack_ffffffffffffff68,SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0),
                     (ImGuiWindowFlags)in_stack_ffffffffffffff60);
  if (bVar1) {
    ImVec2::ImVec2(&local_30,0.0,0.0);
    PushStyleVar(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
    for (local_34 = 0; (int)local_34 < 99; local_34 = local_34 + 1) {
      puVar2 = local_20 + (long)(int)local_34 * 4;
      if ((int)local_34 < (int)*(short *)((long)local_20 + 0xdfe)) {
        cVar4 = 'u';
      }
      else {
        in_stack_ffffffffffffff75 = 0x20;
        in_stack_ffffffffffffff76 = 'r';
        cVar4 = in_stack_ffffffffffffff76;
        if ((int)local_34 < (int)(short)local_20[0x380]) {
          in_stack_ffffffffffffff76 = ' ';
          cVar4 = in_stack_ffffffffffffff76;
        }
      }
      in_stack_ffffffffffffff77 = cVar4;
      if (cVar4 == ' ') {
        BeginDisabled(SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
      }
      memset(local_88,0,0x40);
      if ((cVar4 != ' ') && (puVar2[3] != 0xffffffff)) {
        ImTextStrToUtf8(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                        (ImWchar *)
                        CONCAT17(in_stack_ffffffffffffff77,
                                 CONCAT16(in_stack_ffffffffffffff76,
                                          CONCAT15(in_stack_ffffffffffffff75,
                                                   CONCAT14(in_stack_ffffffffffffff74,
                                                            in_stack_ffffffffffffff70)))),
                        (ImWchar *)in_stack_ffffffffffffff68);
      }
      in_stack_ffffffffffffff60 = local_88;
      Text("%c [%02d] where %03d, insert %03d, delete %03d, char_storage %03d \"%s\"",
           (ulong)(uint)(int)cVar4,(ulong)local_34,(ulong)*puVar2,(ulong)puVar2[1],(ulong)puVar2[2],
           puVar2[3]);
      if (cVar4 == ' ') {
        EndDisabled();
      }
    }
    PopStyleVar(CONCAT13(in_stack_ffffffffffffff77,
                         CONCAT12(in_stack_ffffffffffffff76,
                                  CONCAT11(in_stack_ffffffffffffff75,in_stack_ffffffffffffff74))));
  }
  EndChild();
  return;
}

Assistant:

void ImGui::DebugNodeInputTextState(ImGuiInputTextState* state)
{
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    ImGuiContext& g = *GImGui;
    ImStb::STB_TexteditState* stb_state = &state->Stb;
    ImStb::StbUndoState* undo_state = &stb_state->undostate;
    Text("ID: 0x%08X, ActiveID: 0x%08X", state->ID, g.ActiveId);
    DebugLocateItemOnHover(state->ID);
    Text("CurLenW: %d, CurLenA: %d, Cursor: %d, Selection: %d..%d", state->CurLenA, state->CurLenW, stb_state->cursor, stb_state->select_start, stb_state->select_end);
    Text("undo_point: %d, redo_point: %d, undo_char_point: %d, redo_char_point: %d", undo_state->undo_point, undo_state->redo_point, undo_state->undo_char_point, undo_state->redo_char_point);
    if (BeginChild("undopoints", ImVec2(0.0f, GetTextLineHeight() * 15), true)) // Visualize undo state
    {
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0, 0));
        for (int n = 0; n < STB_TEXTEDIT_UNDOSTATECOUNT; n++)
        {
            ImStb::StbUndoRecord* undo_rec = &undo_state->undo_rec[n];
            const char undo_rec_type = (n < undo_state->undo_point) ? 'u' : (n >= undo_state->redo_point) ? 'r' : ' ';
            if (undo_rec_type == ' ')
                BeginDisabled();
            char buf[64] = "";
            if (undo_rec_type != ' ' && undo_rec->char_storage != -1)
                ImTextStrToUtf8(buf, IM_ARRAYSIZE(buf), undo_state->undo_char + undo_rec->char_storage, undo_state->undo_char + undo_rec->char_storage + undo_rec->insert_length);
            Text("%c [%02d] where %03d, insert %03d, delete %03d, char_storage %03d \"%s\"",
                undo_rec_type, n, undo_rec->where, undo_rec->insert_length, undo_rec->delete_length, undo_rec->char_storage, buf);
            if (undo_rec_type == ' ')
                EndDisabled();
        }
        PopStyleVar();
    }
    EndChild();
#else
    IM_UNUSED(state);
#endif
}